

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Expr * sqlite3VectorFieldSubexpr(Expr *pVector,int i)

{
  int iVar1;
  int in_ESI;
  Expr *in_RDI;
  Expr *local_8;
  
  iVar1 = sqlite3ExprIsVector((Expr *)0x1d0907);
  local_8 = in_RDI;
  if (iVar1 != 0) {
    if ((in_RDI->op == 0x8b) || (in_RDI->op2 == 0x8b)) {
      local_8 = ((in_RDI->x).pSelect)->pEList->a[in_ESI].pExpr;
    }
    else {
      local_8 = ((in_RDI->x).pList)->a[in_ESI].pExpr;
    }
  }
  return local_8;
}

Assistant:

SQLITE_PRIVATE Expr *sqlite3VectorFieldSubexpr(Expr *pVector, int i){
  assert( i<sqlite3ExprVectorSize(pVector) || pVector->op==TK_ERROR );
  if( sqlite3ExprIsVector(pVector) ){
    assert( pVector->op2==0 || pVector->op==TK_REGISTER );
    if( pVector->op==TK_SELECT || pVector->op2==TK_SELECT ){
      assert( ExprUseXSelect(pVector) );
      return pVector->x.pSelect->pEList->a[i].pExpr;
    }else{
      assert( ExprUseXList(pVector) );
      return pVector->x.pList->a[i].pExpr;
    }
  }
  return pVector;
}